

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O0

void websocketpp::sha1::calc(void *src,size_t bytelength,uchar *hash)

{
  ulong uVar1;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  int hashByte;
  size_t lastBlockBytes;
  int roundPos;
  size_t endOfFullBlocks;
  size_t currentBlock;
  size_t endCurrentBlock;
  uint w [80];
  uchar *sarray;
  uint result [5];
  int local_1b4;
  ulong local_1b0;
  int local_1a4;
  ulong local_198;
  uint *in_stack_fffffffffffffe78;
  uint *in_stack_fffffffffffffe80;
  uint local_38 [8];
  long local_18;
  ulong local_10;
  
  local_38[0] = 0x67452301;
  local_38[1] = 0xefcdab89;
  local_38[2] = 0x98badcfe;
  local_38[3] = 0x10325476;
  local_38[4] = 0xc3d2e1f0;
  local_198 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (0x3f < in_RSI) {
    while (local_198 <= in_RSI - 0x40) {
      uVar1 = local_198 + 0x40;
      local_1a4 = 0;
      for (; local_198 < uVar1; local_198 = local_198 + 4) {
        *(uint *)(&stack0xfffffffffffffe78 + (long)local_1a4 * 4) =
             CONCAT13(*(undefined1 *)(in_RDI + local_198),
                      CONCAT12(*(undefined1 *)(in_RDI + 1 + local_198),
                               CONCAT11(*(undefined1 *)(in_RDI + 2 + local_198),
                                        *(undefined1 *)(in_RDI + 3 + local_198))));
        local_1a4 = local_1a4 + 1;
      }
      anon_unknown_1::innerHash(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
  }
  anon_unknown_1::clearWBuffert((uint *)&stack0xfffffffffffffe78);
  for (local_1b0 = 0; local_1b0 < local_10 - local_198; local_1b0 = local_1b0 + 1) {
    *(uint *)(&stack0xfffffffffffffe78 + (local_1b0 >> 2) * 4) =
         (uint)*(byte *)(in_RDI + local_1b0 + local_198) <<
         (('\x03' - ((byte)local_1b0 & 3)) * '\b' & 0x1f) |
         *(uint *)(&stack0xfffffffffffffe78 + (local_1b0 >> 2) * 4);
  }
  *(uint *)(&stack0xfffffffffffffe78 + (local_1b0 >> 2) * 4) =
       0x80 << (('\x03' - ((byte)local_1b0 & 3)) * '\b' & 0x1f) |
       *(uint *)(&stack0xfffffffffffffe78 + (local_1b0 >> 2) * 4);
  if (0x37 < local_10 - local_198) {
    anon_unknown_1::innerHash(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    anon_unknown_1::clearWBuffert((uint *)&stack0xfffffffffffffe78);
  }
  anon_unknown_1::innerHash(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_1b4 = 0x14;
  while (local_1b4 = local_1b4 + -1, -1 < local_1b4) {
    *(char *)(local_18 + local_1b4) =
         (char)(local_38[local_1b4 >> 2] >> (sbyte)((3U - local_1b4 & 3) << 3));
  }
  return;
}

Assistant:

inline void calc(void const * src, size_t bytelength, unsigned char * hash) {
    // Init the result array.
    unsigned int result[5] = { 0x67452301, 0xefcdab89, 0x98badcfe,
                               0x10325476, 0xc3d2e1f0 };

    // Cast the void src pointer to be the byte array we can work with.
    unsigned char const * sarray = (unsigned char const *) src;

    // The reusable round buffer
    unsigned int w[80];

    // Loop through all complete 64byte blocks.

    size_t endCurrentBlock;
    size_t currentBlock = 0;

    if (bytelength >= 64) {
        size_t const endOfFullBlocks = bytelength - 64;

        while (currentBlock <= endOfFullBlocks) {
            endCurrentBlock = currentBlock + 64;

            // Init the round buffer with the 64 byte block data.
            for (int roundPos = 0; currentBlock < endCurrentBlock; currentBlock += 4)
            {
                // This line will swap endian on big endian and keep endian on
                // little endian.
                w[roundPos++] = (unsigned int) sarray[currentBlock + 3]
                        | (((unsigned int) sarray[currentBlock + 2]) << 8)
                        | (((unsigned int) sarray[currentBlock + 1]) << 16)
                        | (((unsigned int) sarray[currentBlock]) << 24);
            }
            innerHash(result, w);
        }
    }

    // Handle the last and not full 64 byte block if existing.
    endCurrentBlock = bytelength - currentBlock;
    clearWBuffert(w);
    size_t lastBlockBytes = 0;
    for (;lastBlockBytes < endCurrentBlock; ++lastBlockBytes) {
        w[lastBlockBytes >> 2] |= (unsigned int) sarray[lastBlockBytes + currentBlock] << ((3 - (lastBlockBytes & 3)) << 3);
    }

    w[lastBlockBytes >> 2] |= 0x80 << ((3 - (lastBlockBytes & 3)) << 3);
    if (endCurrentBlock >= 56) {
        innerHash(result, w);
        clearWBuffert(w);
    }
    w[15] = bytelength << 3;
    innerHash(result, w);

    // Store hash in result pointer, and make sure we get in in the correct
    // order on both endian models.
    for (int hashByte = 20; --hashByte >= 0;) {
        hash[hashByte] = (result[hashByte >> 2] >> (((3 - hashByte) & 0x3) << 3)) & 0xff;
    }
}